

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

int Abc_NtkSuppCharCommon(uint *pBuffer,Vec_Int_t *vOne)

{
  uint uVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < vOne->nSize; i = i + 1) {
    uVar1 = Vec_IntEntry(vOne,i);
    iVar2 = iVar2 + (uint)((pBuffer[(int)uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0);
  }
  return iVar2;
}

Assistant:

int Abc_NtkSuppCharCommon( unsigned * pBuffer, Vec_Int_t * vOne )
{
    int i, Entry, nCommon = 0;
    Vec_IntForEachEntry( vOne, Entry, i )
        nCommon += Abc_InfoHasBit(pBuffer, Entry);
    return nCommon;
}